

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

char * __thiscall
duckdb::StrfTimeFormat::WriteStandardSpecifier
          (StrfTimeFormat *this,StrTimeSpecifier specifier,int32_t *data,char *tz_name,size_t tz_len
          ,char *target)

{
  undefined2 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  InternalException *this_00;
  char cVar8;
  uint uVar9;
  undefined1 *puVar10;
  long lVar11;
  undefined7 in_register_00000031;
  int32_t year;
  string local_40;
  
  switch((int)CONCAT71(in_register_00000031,specifier)) {
  case 3:
    iVar2 = data[2];
    break;
  case 4:
    uVar3 = data[2] % 100;
    if (9 < uVar3) goto LAB_01145fc4;
    goto LAB_01145fdb;
  case 5:
    iVar2 = data[1];
    puVar10 = Date::MONTH_NAMES_ABBREVIATED;
    goto LAB_01145f53;
  case 6:
    iVar2 = data[1];
    puVar10 = Date::MONTH_NAMES;
LAB_01145f53:
    lVar11 = (long)iVar2 * 0x10;
    uVar5 = (ulong)*(uint *)(puVar10 + lVar11 + -0x10);
    if (uVar5 < 0xd) {
      puVar10 = puVar10 + lVar11 + -0xc;
    }
    else {
      puVar10 = *(undefined1 **)(puVar10 + lVar11 + -8);
    }
    switchD_012dd528::default(target,puVar10,uVar5);
    return target + uVar5;
  case 7:
    iVar2 = data[1];
    break;
  case 8:
    uVar3 = data[1];
    goto LAB_01145fbd;
  case 9:
    uVar3 = *data;
    uVar9 = -uVar3;
    if (0 < (int)uVar3) {
      uVar9 = uVar3;
    }
    uVar1 = *(undefined2 *)
             (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(uVar9 % 100) * 2);
    goto LAB_01145fcf;
  case 10:
    uVar9 = *data;
    uVar3 = -uVar9;
    if (0 < (int)uVar9) {
      uVar3 = uVar9;
    }
    uVar3 = uVar3 % 100;
    if (9 < uVar3) {
      *target = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)uVar3 * 2];
      target[1] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uVar3 * 2) + 1];
      goto LAB_01145fd2;
    }
    goto LAB_01145fdb;
  case 0xb:
    uVar3 = *data;
    if (uVar3 < 10000) {
      lVar11 = 2;
      do {
        *(undefined2 *)(target + lVar11 * 2 + -2) =
             *(undefined2 *)
              (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(uVar3 % 100) * 2);
        lVar11 = lVar11 + -1;
        uVar3 = uVar3 / 100;
      } while (lVar11 != 0);
      return target + 4;
    }
    if ((int)uVar3 < 0) {
      *target = '-';
      uVar3 = -uVar3;
      target = target + 1;
    }
    iVar2 = NumericHelper::UnsignedLength<unsigned_int>(uVar3);
    NumericHelper::FormatUnsigned<int>(uVar3,target + iVar2);
    return target + iVar2;
  case 0xc:
    iVar2 = data[3];
    break;
  case 0xd:
    uVar3 = data[3];
    goto LAB_01145fbd;
  case 0xe:
    iVar2 = data[3];
    iVar2 = iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 1) - (iVar2 >> 0x1f)) * -0xc;
    uVar5 = 0x18;
    if (iVar2 != 0) {
      uVar5 = (ulong)(uint)(iVar2 * 2);
    }
    goto LAB_01145f34;
  case 0xf:
    iVar2 = data[3];
    uVar9 = iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 1) - (iVar2 >> 0x1f)) * -0xc;
    uVar3 = 0xc;
    if (uVar9 != 0) {
      uVar3 = uVar9;
    }
    if ((byte)uVar3 < 10) {
      *target = (byte)uVar3 | 0x30;
      goto LAB_01145fdf;
    }
    goto LAB_01145fc4;
  case 0x10:
    cVar8 = 'A';
    if (0xb < data[3]) {
      cVar8 = 'P';
    }
    *target = cVar8;
    target[1] = 'M';
    goto LAB_01145fd2;
  case 0x11:
    iVar2 = data[4];
    break;
  case 0x12:
    uVar3 = data[4];
    goto LAB_01145fbd;
  case 0x13:
    iVar2 = data[5];
    break;
  case 0x14:
    uVar3 = data[5];
LAB_01145fbd:
    if ((byte)uVar3 < 10) {
LAB_01145fdb:
      *target = (byte)uVar3 | 0x30;
LAB_01145fdf:
      return target + 1;
    }
LAB_01145fc4:
    uVar1 = *(undefined2 *)
             (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(uVar3 & 0xff) * 2);
    goto LAB_01145fcf;
  case 0x15:
    lVar11 = 3;
    uVar3 = data[6] / 1000;
    do {
      *(undefined2 *)(target + lVar11 * 2 + -2) =
           *(undefined2 *)
            (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(uVar3 % 100) * 2);
      lVar11 = lVar11 + -1;
      uVar3 = uVar3 / 100;
    } while (lVar11 != 0);
    return target + 6;
  case 0x16:
    pcVar7 = WritePadded3(this,target,data[6] / 1000000);
    return pcVar7;
  case 0x17:
    *target = (char)(data[7] >> 0x1f) * -2 + '+';
    uVar3 = data[7];
    uVar9 = -uVar3;
    if (0 < (int)uVar3) {
      uVar9 = uVar3;
    }
    uVar3 = uVar9 % 0xe10;
    uVar4 = uVar3 % 0x3c;
    *(undefined2 *)(target + 1) =
         *(undefined2 *)
          (duckdb_fmt::v6::internal::basic_data<void>::digits + ((ulong)uVar9 / 0xe10) * 2);
    if (uVar3 < 0x3c && uVar4 == 0) {
      pcVar7 = target + 3;
    }
    else {
      target[3] = ':';
      *(undefined2 *)(target + 4) =
           *(undefined2 *)
            (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(uVar3 / 0x3c) * 2);
      pcVar7 = target + 6;
    }
    if (uVar4 == 0) {
      return pcVar7;
    }
    *pcVar7 = ':';
    pcVar7[1] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)uVar4 * 2];
    pcVar7[2] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(uVar4 * 2) + 1];
    return pcVar7 + 3;
  case 0x18:
    if (tz_name == (char *)0x0) {
      return target;
    }
    switchD_012dd528::default(target,tz_name,tz_len);
    sVar6 = strlen(tz_name);
    return target + sVar6;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented specifier for WriteStandardSpecifier in strftime",
               "");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x20:
    pcVar7 = WritePadded(this,target,data[6],9);
    return pcVar7;
  }
  uVar5 = (ulong)(uint)(iVar2 * 2);
LAB_01145f34:
  uVar1 = *(undefined2 *)(duckdb_fmt::v6::internal::basic_data<void>::digits + uVar5);
LAB_01145fcf:
  *(undefined2 *)target = uVar1;
LAB_01145fd2:
  return target + 2;
}

Assistant:

char *StrfTimeFormat::WriteStandardSpecifier(StrTimeSpecifier specifier, int32_t data[], const char *tz_name,
                                             size_t tz_len, char *target) const {
	// data contains [0] year, [1] month, [2] day, [3] hour, [4] minute, [5] second, [6] ns, [7] utc (secs)
	switch (specifier) {
	case StrTimeSpecifier::DAY_OF_MONTH_PADDED:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[2]));
		break;
	case StrTimeSpecifier::ABBREVIATED_MONTH_NAME: {
		auto &month_name = Date::MONTH_NAMES_ABBREVIATED[data[1] - 1];
		return WriteString(target, month_name);
	}
	case StrTimeSpecifier::FULL_MONTH_NAME: {
		auto &month_name = Date::MONTH_NAMES[data[1] - 1];
		return WriteString(target, month_name);
	}
	case StrTimeSpecifier::MONTH_DECIMAL_PADDED:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[1]));
		break;
	case StrTimeSpecifier::YEAR_WITHOUT_CENTURY_PADDED:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(AbsValue(data[0]) % 100));
		break;
	case StrTimeSpecifier::YEAR_DECIMAL:
		if (data[0] >= 0 && data[0] <= 9999) {
			target = WritePadded(target, UnsafeNumericCast<uint32_t>(data[0]), 4);
		} else {
			int32_t year = data[0];
			if (data[0] < 0) {
				*target = '-';
				year = -year;
				target++;
			}
			auto len = NumericHelper::UnsignedLength<uint32_t>(UnsafeNumericCast<uint32_t>(year));
			NumericHelper::FormatUnsigned(year, target + len);
			target += len;
		}
		break;
	case StrTimeSpecifier::HOUR_24_PADDED: {
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[3]));
		break;
	}
	case StrTimeSpecifier::HOUR_12_PADDED: {
		int hour = data[3] % 12;
		if (hour == 0) {
			hour = 12;
		}
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(hour));
		break;
	}
	case StrTimeSpecifier::AM_PM:
		*target++ = data[3] >= 12 ? 'P' : 'A';
		*target++ = 'M';
		break;
	case StrTimeSpecifier::MINUTE_PADDED: {
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[4]));
		break;
	}
	case StrTimeSpecifier::SECOND_PADDED:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[5]));
		break;
	case StrTimeSpecifier::NANOSECOND_PADDED:
		target = WritePadded(target, UnsafeNumericCast<uint32_t>(data[6]), 9);
		break;
	case StrTimeSpecifier::MICROSECOND_PADDED:
		target = WritePadded(target, UnsafeNumericCast<uint32_t>(data[6] / Interval::NANOS_PER_MICRO), 6);
		break;
	case StrTimeSpecifier::MILLISECOND_PADDED:
		target = WritePadded3(target, UnsafeNumericCast<uint32_t>(data[6] / Interval::NANOS_PER_MSEC));
		break;
	case StrTimeSpecifier::UTC_OFFSET: {
		*target++ = (data[7] < 0) ? '-' : '+';

		auto offset = abs(data[7]);
		int hh, mm, ss;
		StrfTimeSplitOffset(offset, hh, mm, ss);
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(hh));
		if (mm || ss) {
			*target++ = ':';
			target = WritePadded2(target, UnsafeNumericCast<uint32_t>(mm));
		}
		if (ss) {
			*target++ = ':';
			target = WritePadded2(target, UnsafeNumericCast<uint32_t>(ss));
		}
		break;
	}
	case StrTimeSpecifier::TZ_NAME:
		if (tz_name) {
			memcpy(target, tz_name, tz_len);
			target += strlen(tz_name);
		}
		break;
	case StrTimeSpecifier::DAY_OF_MONTH: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[2] % 100));
		break;
	}
	case StrTimeSpecifier::MONTH_DECIMAL: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[1]));
		break;
	}
	case StrTimeSpecifier::YEAR_WITHOUT_CENTURY: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(AbsValue(data[0]) % 100));
		break;
	}
	case StrTimeSpecifier::HOUR_24_DECIMAL: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[3]));
		break;
	}
	case StrTimeSpecifier::HOUR_12_DECIMAL: {
		int hour = data[3] % 12;
		if (hour == 0) {
			hour = 12;
		}
		target = Write2(target, UnsafeNumericCast<uint8_t>(hour));
		break;
	}
	case StrTimeSpecifier::MINUTE_DECIMAL: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[4]));
		break;
	}
	case StrTimeSpecifier::SECOND_DECIMAL: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[5]));
		break;
	}
	default:
		throw InternalException("Unimplemented specifier for WriteStandardSpecifier in strftime");
	}
	return target;
}